

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateLayoutTest.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_93202::StateLayoutTest::update
          (StateLayoutTest *this,ms_t param_1,ivec2 windowSize)

{
  __uniq_ptr_impl<GUILayout,_std::default_delete<GUILayout>_> this_00;
  pointer ppNVar1;
  NamedElement **elem;
  pointer ppNVar2;
  ImVec2 local_48;
  vector<std::unique_ptr<GUILayout,_std::default_delete<GUILayout>_>,_std::allocator<std::unique_ptr<GUILayout,_std::default_delete<GUILayout>_>_>_>
  *local_40;
  ImVec2 local_38;
  
  local_40 = &this->m_layouts;
  this_00._M_t.super__Tuple_impl<0UL,_GUILayout_*,_std::default_delete<GUILayout>_>.
  super__Head_base<0UL,_GUILayout_*,_false>._M_head_impl =
       (this->m_layouts).
       super__Vector_base<std::unique_ptr<GUILayout,_std::default_delete<GUILayout>_>,_std::allocator<std::unique_ptr<GUILayout,_std::default_delete<GUILayout>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[this->m_curLayoutIndex]._M_t.
       super___uniq_ptr_impl<GUILayout,_std::default_delete<GUILayout>_>._M_t;
  GUILayout::update((GUILayout *)
                    this_00._M_t.
                    super__Tuple_impl<0UL,_GUILayout_*,_std::default_delete<GUILayout>_>.
                    super__Head_base<0UL,_GUILayout_*,_false>._M_head_impl,windowSize);
  ppNVar2 = (((vector<GUILayout::NamedElement_*,_std::allocator<GUILayout::NamedElement_*>_> *)
             ((long)this_00._M_t.
                    super__Tuple_impl<0UL,_GUILayout_*,_std::default_delete<GUILayout>_>.
                    super__Head_base<0UL,_GUILayout_*,_false>._M_head_impl + 0x30))->
            super__Vector_base<GUILayout::NamedElement_*,_std::allocator<GUILayout::NamedElement_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppNVar1 = *(pointer *)
             ((long)this_00._M_t.
                    super__Tuple_impl<0UL,_GUILayout_*,_std::default_delete<GUILayout>_>.
                    super__Head_base<0UL,_GUILayout_*,_false>._M_head_impl + 0x38);
  if (ppNVar2 != ppNVar1) {
    do {
      local_48.x = (float)((*ppNVar2)->topLeft).x;
      local_48.y = (float)((*ppNVar2)->topLeft).y;
      local_38.x = 0.0;
      local_38.y = 0.0;
      ImGui::SetNextWindowPos(&local_48,0,&local_38);
      local_48.x = (float)((*ppNVar2)->size).x;
      local_48.y = (float)((*ppNVar2)->size).y;
      ImGui::SetNextWindowSize(&local_48,0);
      ImGui::Begin(((*ppNVar2)->name)._M_dataplus._M_p,(bool *)0x0,0);
      ImGui::End();
      ppNVar2 = ppNVar2 + 1;
    } while (ppNVar2 != ppNVar1);
  }
  ImGui::Begin("Selector",(bool *)0x0,0);
  ImGui::ListBox("Layouts",&this->m_curLayoutIndex,update::anon_class_1_0_00000001::__invoke,
                 local_40,(int)((ulong)((long)(this->m_layouts).
                                              super__Vector_base<std::unique_ptr<GUILayout,_std::default_delete<GUILayout>_>,_std::allocator<std::unique_ptr<GUILayout,_std::default_delete<GUILayout>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this->m_layouts).
                                             super__Vector_base<std::unique_ptr<GUILayout,_std::default_delete<GUILayout>_>,_std::allocator<std::unique_ptr<GUILayout,_std::default_delete<GUILayout>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3),10);
  ImGui::End();
  return;
}

Assistant:

virtual void update(ms_t, ivec2 windowSize) override
    {
        auto cur = m_layouts[m_curLayoutIndex].get();
        cur->update(windowSize);
        for (auto& elem : cur->namedElements())
        {
            ImGui::SetNextWindowPos({float(elem->topLeft.x), float(elem->topLeft.y)});
            ImGui::SetNextWindowSize({float(elem->size.x), float(elem->size.y)});
            ImGui::Begin(elem->name.c_str());
            ImGui::End();
        }

        ImGui::Begin("Selector");
        auto selector = [](void* pdata, int index, const char** out) {
            auto& data = *static_cast<std::vector<std::unique_ptr<GUILayout>>*>(pdata);
            *out = data[index]->name();
            return true;
        };
        ImGui::ListBox("Layouts", &m_curLayoutIndex, selector, &m_layouts, int(m_layouts.size()), 10);
        ImGui::End();
    }